

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NetworkBrokerData.cpp
# Opt level: O1

shared_ptr<helics::helicsCLI11App> __thiscall
helics::NetworkBrokerData::commandLineParser
          (NetworkBrokerData *this,string_view localAddress,bool enableConfig)

{
  HelicsConfigJSON *pHVar1;
  Option *pOVar2;
  Option *this_00;
  App *pAVar3;
  undefined7 in_register_00000009;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  long lVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *variable;
  int in_R8D;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  shared_ptr<helics::helicsCLI11App> sVar7;
  initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  values;
  initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  values_00;
  initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  values_01;
  _Any_data local_c58;
  _Manager_type local_c48;
  code *pcStack_c40;
  _Any_data local_c30;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c20;
  _Any_data local_c10;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_bf0;
  undefined8 local_be8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_be0;
  undefined4 local_bd0;
  undefined2 local_bcc;
  code *local_bc8;
  code *local_bc0;
  _Any_data local_bb8;
  code *local_ba8;
  code *pcStack_ba0;
  string local_b98;
  string local_b78;
  string local_b58;
  string local_b38;
  string local_b18;
  undefined1 *local_af8 [2];
  undefined1 local_ae8 [16];
  long *local_ad8;
  long local_ad0;
  long local_ac8 [2];
  _Any_data local_ab8;
  code *local_aa8;
  code *pcStack_aa0;
  _Any_data local_a98;
  code *local_a88;
  undefined8 uStack_a80;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_a78;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_a38;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_9f8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_9b8;
  string local_978;
  string local_958;
  string local_938;
  string local_918;
  string local_8f8;
  string local_8d8;
  string local_8b8;
  string local_898;
  string local_878;
  string local_858;
  string local_838;
  string local_818;
  string local_7f8;
  string local_7d8;
  string local_7b8;
  string local_798;
  string local_778;
  string local_758;
  string local_738;
  string local_718;
  string local_6f8;
  string local_6d8;
  string local_6b8;
  string local_698;
  string local_678;
  string local_658;
  string local_638;
  string local_618;
  string local_5f8;
  string local_5d8;
  string local_5b8;
  string local_598;
  string local_578;
  string local_558;
  string local_538;
  string local_518;
  string local_4f8;
  string local_4d8;
  string local_4b8;
  string local_498;
  string local_478;
  string local_458;
  string local_438;
  string local_418;
  string local_3f8;
  string local_3d8;
  string local_3b8;
  _Any_data local_398;
  code *local_388;
  undefined8 local_380;
  _Any_data local_378;
  code *local_368;
  undefined8 local_360;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_358;
  undefined8 local_350;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_348;
  undefined4 local_338;
  undefined2 local_334;
  _Any_data local_328;
  code *local_318;
  code *local_310;
  _Any_data local_308;
  code *local_2f8;
  undefined8 local_2f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_2e8;
  size_type local_2e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2d8;
  undefined4 local_2c8;
  undefined2 local_2c4;
  _Any_data local_2b8;
  code *local_2a8;
  undefined8 local_2a0;
  _Any_data local_298;
  code *local_288;
  undefined8 local_280;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_278;
  undefined8 local_270;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_268;
  undefined4 local_258;
  undefined2 local_254;
  _Any_data local_248;
  code *local_238;
  code *pcStack_230;
  _Any_data local_220;
  code *local_210;
  _Any_data local_200;
  code *local_1f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1e0 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1d0;
  undefined4 local_1c0;
  undefined1 local_1bc;
  undefined1 uStack_1bb;
  _Any_data local_1b8;
  code *local_1a8;
  _Any_data local_198;
  code *local_188;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_178 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_168;
  undefined4 local_158;
  undefined1 local_154;
  undefined1 uStack_153;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  local_bc0 = (code *)CONCAT71(in_register_00000009,enableConfig);
  local_bc8 = (code *)localAddress._M_str;
  variable = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             localAddress._M_len;
  (this->brokerName)._M_dataplus._M_p = (pointer)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<helics::helicsCLI11App,std::allocator<helics::helicsCLI11App>,char_const(&)[94]>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&(this->brokerName)._M_string_length,
             (helicsCLI11App **)this,(allocator<helics::helicsCLI11App> *)&local_ab8,
             (char (*) [94])
             "Network connection information \n(arguments allow \'_\' characters in the names and ignore them)"
            );
  if (in_R8D != 0) {
    pHVar1 = addJsonConfig((App *)(this->brokerName)._M_dataplus._M_p);
    (pHVar1->super_ConfigBase).maximumLayers = '\0';
    local_50[0] = local_40;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"helics","");
    commandLineParser();
  }
  pAVar3 = (App *)(this->brokerName)._M_dataplus._M_p;
  (pAVar3->option_defaults_).super_OptionBase<CLI::OptionDefaults>.ignore_case_ = true;
  (pAVar3->option_defaults_).super_OptionBase<CLI::OptionDefaults>.ignore_underscore_ = true;
  local_3b8._M_dataplus._M_p = (pointer)&local_3b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_3b8,"--local{0},--ipv4{4},--ipv6{6},--all{10},--external{10}","");
  local_3d8._M_dataplus._M_p = (pointer)&local_3d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_3d8,"specify external interface to use, default is --local","");
  pOVar2 = CLI::App::add_flag<gmlc::networking::InterfaceNetworks,_(CLI::detail::enabler)0>
                     (pAVar3,&local_3b8,
                      (InterfaceNetworks *)(variable[5].field_2._M_local_buf + 0xc),&local_3d8);
  (pOVar2->super_OptionBase<CLI::Option>).disable_flag_override_ = true;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d8._M_dataplus._M_p != &local_3d8.field_2) {
    operator_delete(local_3d8._M_dataplus._M_p,local_3d8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b8._M_dataplus._M_p != &local_3b8.field_2) {
    operator_delete(local_3b8._M_dataplus._M_p,local_3b8.field_2._M_allocated_capacity + 1);
  }
  pAVar3 = (App *)(this->brokerName)._M_dataplus._M_p;
  local_b18._M_dataplus._M_p = (pointer)&local_b18.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b18,"--network_connectivity","");
  local_b38._M_dataplus._M_p = (pointer)&local_b38.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_b38,"specify the connectivity of the network interface","");
  this_00 = CLI::App::
            add_option<gmlc::networking::InterfaceNetworks,_gmlc::networking::InterfaceNetworks,_(CLI::detail::enabler)0>
                      (pAVar3,&local_b18,
                       (InterfaceNetworks *)(variable[5].field_2._M_local_buf + 0xc),&local_b38);
  CLI::std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[6],_const_char_(&)[2],_true>
            ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_ab8,(char (*) [6])0x44e92a,(char (*) [2])0x45ed46);
  CLI::std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[5],_const_char_(&)[2],_true>
            (&local_a78,(char (*) [5])"ipv4",(char (*) [2])0x4582d4);
  CLI::std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[5],_const_char_(&)[2],_true>
            (&local_a38,(char (*) [5])"ipv6",(char (*) [2])0x46236b);
  CLI::std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[9],_const_char_(&)[3],_true>
            (&local_9f8,(char (*) [9])"external",(char (*) [3])0x458655);
  CLI::std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[4],_const_char_(&)[3],_true>
            (&local_9b8,(char (*) [4])0x45331e,(char (*) [3])0x458655);
  values._M_len = 5;
  values._M_array = (iterator)&local_ab8;
  CLI::CheckedTransformer::CheckedTransformer<>((CheckedTransformer *)&local_c30,values);
  local_2b8._M_unused._M_object = (void *)0x0;
  local_2b8._8_8_ = 0;
  local_2a8 = (code *)0x0;
  local_2a0 = local_c20._8_8_;
  if ((code *)local_c20._M_allocated_capacity != (code *)0x0) {
    local_2b8._M_unused._M_object = local_c30._M_unused._M_object;
    local_2b8._8_8_ = local_c30._8_8_;
    local_2a8 = (code *)local_c20._M_allocated_capacity;
    local_c20._M_allocated_capacity = 0;
    local_c20._8_8_ = 0;
  }
  local_298._M_unused._M_object =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)0x0;
  local_298._8_8_ = 0;
  local_288 = (code *)0x0;
  local_280 = local_c00._8_8_;
  if ((code *)local_c00._M_allocated_capacity != (code *)0x0) {
    local_298._M_unused._M_object = local_c10._M_unused._M_object;
    local_298._8_8_ = local_c10._8_8_;
    local_288 = (code *)local_c00._M_allocated_capacity;
    local_c00._M_allocated_capacity = 0;
    local_c00._8_8_ = 0;
  }
  if (local_bf0 == &local_be0) {
    local_268._8_4_ = local_be0._8_4_;
    local_268._12_4_ = local_be0._12_4_;
    local_278 = &local_268;
  }
  else {
    local_278 = local_bf0;
  }
  local_268._M_allocated_capacity._4_4_ = local_be0._M_allocated_capacity._4_4_;
  local_268._M_allocated_capacity._0_4_ = local_be0._M_allocated_capacity._0_4_;
  local_270 = local_be8;
  local_be8 = 0;
  local_be0._M_allocated_capacity._0_4_ = local_be0._M_allocated_capacity._0_4_ & 0xffffff00;
  local_258 = local_bd0;
  local_254 = local_bcc;
  local_c58._M_unused._M_object = &local_c48;
  local_bf0 = &local_be0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c58,"");
  CLI::std::vector<CLI::Validator,_std::allocator<CLI::Validator>_>::_M_insert_rval
            (&this_00->validators_,
             (this_00->validators_).
             super__Vector_base<CLI::Validator,_std::allocator<CLI::Validator>_>._M_impl.
             super__Vector_impl_data._M_start,(value_type *)&local_2b8);
  if (local_c58._8_8_ != 0) {
    local_af8[0] = local_ae8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_af8,local_c58._M_unused._M_object,
               local_c58._8_8_ + (long)local_c58._M_unused._0_8_);
    commandLineParser();
  }
  CLI::Option::excludes(this_00,pOVar2);
  if ((_Manager_type *)local_c58._M_unused._0_8_ != &local_c48) {
    operator_delete(local_c58._M_unused._M_object,(ulong)(local_c48 + 1));
  }
  if (local_278 != &local_268) {
    operator_delete(local_278,local_268._M_allocated_capacity + 1);
  }
  if (local_288 != (code *)0x0) {
    (*local_288)(&local_298,&local_298,__destroy_functor);
  }
  if (local_2a8 != (code *)0x0) {
    (*local_2a8)((_Any_data *)&local_2b8,(_Any_data *)&local_2b8,__destroy_functor);
  }
  if (local_bf0 != &local_be0) {
    operator_delete(local_bf0,
                    CONCAT44(local_be0._M_allocated_capacity._4_4_,
                             local_be0._M_allocated_capacity._0_4_) + 1);
  }
  if ((code *)local_c00._M_allocated_capacity != (code *)0x0) {
    (*(code *)local_c00._M_allocated_capacity)(&local_c10,&local_c10,3);
  }
  if ((code *)local_c20._M_allocated_capacity != (code *)0x0) {
    (*(code *)local_c20._M_allocated_capacity)(&local_c30,&local_c30,3);
  }
  lVar5 = -0x140;
  paVar6 = &local_9b8.second.field_2;
  do {
    if (paVar6 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(&paVar6->_M_allocated_capacity)[-2]) {
      operator_delete((long *)(&paVar6->_M_allocated_capacity)[-2],paVar6->_M_allocated_capacity + 1
                     );
    }
    if (&paVar6->_M_allocated_capacity + -4 != (size_type *)(&paVar6->_M_allocated_capacity)[-6]) {
      operator_delete((size_type *)(&paVar6->_M_allocated_capacity)[-6],
                      (&paVar6->_M_allocated_capacity)[-4] + 1);
    }
    paVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(&paVar6->_M_allocated_capacity + -8);
    lVar5 = lVar5 + 0x40;
  } while (lVar5 != 0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b38._M_dataplus._M_p != &local_b38.field_2) {
    operator_delete(local_b38._M_dataplus._M_p,local_b38.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b18._M_dataplus._M_p != &local_b18.field_2) {
    operator_delete(local_b18._M_dataplus._M_p,local_b18.field_2._M_allocated_capacity + 1);
  }
  pAVar3 = (App *)(this->brokerName)._M_dataplus._M_p;
  local_3f8._M_dataplus._M_p = (pointer)&local_3f8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3f8,"--broker_address","");
  local_aa8 = (code *)0x0;
  pcStack_aa0 = (code *)0x0;
  local_ab8._M_unused._M_object = (void *)0x0;
  local_ab8._8_8_ = 0;
  local_ab8._M_unused._M_object = operator_new(0x18);
  *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)local_ab8._M_unused._0_8_ =
       variable;
  *(code **)((long)local_ab8._M_unused._0_8_ + 8) = local_bc8;
  *(code **)((long)local_ab8._M_unused._0_8_ + 0x10) = local_bc0;
  pcStack_aa0 = CLI::std::
                _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/network/NetworkBrokerData.cpp:48:13)>
                ::_M_invoke;
  local_aa8 = CLI::std::
              _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/network/NetworkBrokerData.cpp:48:13)>
              ::_M_manager;
  local_418._M_dataplus._M_p = (pointer)&local_418.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_418,"location of the broker i.e. network address","");
  pOVar2 = CLI::App::add_option_function<std::__cxx11::string>
                     (pAVar3,&local_3f8,
                      (function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                       *)&local_ab8,&local_418);
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"HELICS_BROKER_ADDRESS","");
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&pOVar2->envname_,
             &local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_418._M_dataplus._M_p != &local_418.field_2) {
    operator_delete(local_418._M_dataplus._M_p,local_418.field_2._M_allocated_capacity + 1);
  }
  if (local_aa8 != (code *)0x0) {
    (*local_aa8)(&local_ab8,&local_ab8,3);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f8._M_dataplus._M_p != &local_3f8.field_2) {
    operator_delete(local_3f8._M_dataplus._M_p,local_3f8.field_2._M_allocated_capacity + 1);
  }
  pAVar3 = (App *)(this->brokerName)._M_dataplus._M_p;
  local_438._M_dataplus._M_p = (pointer)&local_438.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_438,"--reuse_address","");
  local_458._M_dataplus._M_p = (pointer)&local_458.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_458,
             "allow the server to reuse a bound address, mostly useful for tcp cores","");
  CLI::App::add_flag<bool,_(CLI::detail::enabler)0>
            (pAVar3,&local_438,(bool *)(variable[5].field_2._M_local_buf + 0xd),&local_458);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_458._M_dataplus._M_p != &local_458.field_2) {
    operator_delete(local_458._M_dataplus._M_p,local_458.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_438._M_dataplus._M_p != &local_438.field_2) {
    operator_delete(local_438._M_dataplus._M_p,local_438.field_2._M_allocated_capacity + 1);
  }
  pAVar3 = (App *)(this->brokerName)._M_dataplus._M_p;
  local_478._M_dataplus._M_p = (pointer)&local_478.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_478,"--noackconnect","");
  local_498._M_dataplus._M_p = (pointer)&local_498.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_498,
             "specify that a connection_ack message is not required to be connected with a broker",
             "");
  pOVar2 = CLI::App::add_flag<bool,_(CLI::detail::enabler)0>
                     (pAVar3,&local_478,(bool *)((long)&variable[6]._M_dataplus._M_p + 1),&local_498
                     );
  CLI::Option::ignore_underscore<CLI::App>(pOVar2,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_498._M_dataplus._M_p != &local_498.field_2) {
    operator_delete(local_498._M_dataplus._M_p,local_498.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_478._M_dataplus._M_p != &local_478.field_2) {
    operator_delete(local_478._M_dataplus._M_p,local_478.field_2._M_allocated_capacity + 1);
  }
  pAVar3 = (App *)(this->brokerName)._M_dataplus._M_p;
  local_4b8._M_dataplus._M_p = (pointer)&local_4b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4b8,"--force","");
  local_4d8._M_dataplus._M_p = (pointer)&local_4d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_4d8,
             "if set to true the broker will on an unsuccessful connection as root broker attempt to terminate any existing brokers and reconnect"
             ,"");
  CLI::App::add_flag<bool,_(CLI::detail::enabler)0>
            (pAVar3,&local_4b8,(bool *)((long)&variable[6]._M_dataplus._M_p + 6),&local_4d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4d8._M_dataplus._M_p != &local_4d8.field_2) {
    operator_delete(local_4d8._M_dataplus._M_p,local_4d8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4b8._M_dataplus._M_p != &local_4b8.field_2) {
    operator_delete(local_4b8._M_dataplus._M_p,local_4b8.field_2._M_allocated_capacity + 1);
  }
  pAVar3 = (App *)(this->brokerName)._M_dataplus._M_p;
  local_4f8._M_dataplus._M_p = (pointer)&local_4f8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4f8,"--broker","");
  local_aa8 = (code *)0x0;
  pcStack_aa0 = (code *)0x0;
  local_ab8._M_unused._M_object = (void *)0x0;
  local_ab8._8_8_ = 0;
  local_ab8._M_unused._M_object = operator_new(0x18);
  *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)local_ab8._M_unused._0_8_ =
       variable;
  *(code **)((long)local_ab8._M_unused._0_8_ + 8) = local_bc8;
  *(code **)((long)local_ab8._M_unused._0_8_ + 0x10) = local_bc0;
  pcStack_aa0 = CLI::std::
                _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/network/NetworkBrokerData.cpp:72:9)>
                ::_M_invoke;
  local_aa8 = CLI::std::
              _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/network/NetworkBrokerData.cpp:72:9)>
              ::_M_manager;
  local_518._M_dataplus._M_p = (pointer)&local_518.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_518,
             "identifier for the broker, this is either the name or network address use --broker_address or --brokername to explicitly set the network address or name the search for the broker is first by name"
             ,"");
  CLI::App::add_option_function<std::__cxx11::string>
            (pAVar3,&local_4f8,
             (function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              *)&local_ab8,&local_518);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_518._M_dataplus._M_p != &local_518.field_2) {
    operator_delete(local_518._M_dataplus._M_p,local_518.field_2._M_allocated_capacity + 1);
  }
  if (local_aa8 != (code *)0x0) {
    (*local_aa8)(&local_ab8,&local_ab8,3);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4f8._M_dataplus._M_p != &local_4f8.field_2) {
    operator_delete(local_4f8._M_dataplus._M_p,local_4f8.field_2._M_allocated_capacity + 1);
  }
  pAVar3 = (App *)(this->brokerName)._M_dataplus._M_p;
  local_538._M_dataplus._M_p = (pointer)&local_538.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_538,"--brokername","");
  local_558._M_dataplus._M_p = (pointer)&local_558.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_558,"the name of the broker","");
  CLI::App::
  add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
            (pAVar3,&local_538,variable,&local_558);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_558._M_dataplus._M_p != &local_558.field_2) {
    operator_delete(local_558._M_dataplus._M_p,local_558.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_538._M_dataplus._M_p != &local_538.field_2) {
    operator_delete(local_538._M_dataplus._M_p,local_538.field_2._M_allocated_capacity + 1);
  }
  pAVar3 = (App *)(this->brokerName)._M_dataplus._M_p;
  local_578._M_dataplus._M_p = (pointer)&local_578.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_578,"--maxsize","");
  local_598._M_dataplus._M_p = (pointer)&local_598.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_598,"The message buffer size","")
  ;
  pOVar2 = CLI::App::add_option<int,_int,_(CLI::detail::enabler)0>
                     (pAVar3,&local_578,(int *)variable[5].field_2._M_local_buf,&local_598);
  pOVar2 = CLI::Option::capture_default_str(pOVar2);
  CLI::std::
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>::
  function((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
            *)&local_1b8,
           (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
            *)CLI::PositiveNumber);
  CLI::std::
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::function((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              *)&local_198,
             (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              *)(CLI::PositiveNumber + 0x20));
  local_178[0] = &local_168;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_178,CLI::PositiveNumber._64_8_,
             CLI::PositiveNumber._72_8_ + CLI::PositiveNumber._64_8_);
  _local_154 = CLI::PositiveNumber._100_2_;
  local_158 = CLI::PositiveNumber._96_4_;
  local_c30._M_unused._M_object = &local_c20;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c30,"");
  _local_154 = CONCAT11(1,local_154);
  CLI::std::vector<CLI::Validator,_std::allocator<CLI::Validator>_>::emplace_back<CLI::Validator>
            (&pOVar2->validators_,(Validator *)&local_1b8);
  if (local_c30._8_8_ != 0) {
    local_ab8._M_unused._M_object = &local_aa8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_ab8,local_c30._M_unused._M_object,
               local_c30._8_8_ + (long)local_c30._M_unused._0_8_);
    commandLineParser();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c30._M_unused._0_8_ != &local_c20) {
    operator_delete(local_c30._M_unused._M_object,(ulong)(local_c20._M_allocated_capacity + 1));
  }
  if (local_178[0] != &local_168) {
    operator_delete(local_178[0],local_168._M_allocated_capacity + 1);
  }
  if (local_188 != (code *)0x0) {
    (*local_188)(&local_198,&local_198,__destroy_functor);
  }
  if (local_1a8 != (code *)0x0) {
    (*local_1a8)(&local_1b8,&local_1b8,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_598._M_dataplus._M_p != &local_598.field_2) {
    operator_delete(local_598._M_dataplus._M_p,local_598.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_578._M_dataplus._M_p != &local_578.field_2) {
    operator_delete(local_578._M_dataplus._M_p,local_578.field_2._M_allocated_capacity + 1);
  }
  pAVar3 = (App *)(this->brokerName)._M_dataplus._M_p;
  local_5b8._M_dataplus._M_p = (pointer)&local_5b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_5b8,"--maxcount","");
  local_5d8._M_dataplus._M_p = (pointer)&local_5d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_5d8,"The maximum number of message to have in a queue","");
  pOVar2 = CLI::App::add_option<int,_int,_(CLI::detail::enabler)0>
                     (pAVar3,&local_5b8,(int *)(variable[5].field_2._M_local_buf + 4),&local_5d8);
  pOVar2 = CLI::Option::capture_default_str(pOVar2);
  CLI::std::
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>::
  function((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
            *)&local_220,
           (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
            *)CLI::PositiveNumber);
  CLI::std::
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::function((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              *)&local_200,
             (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              *)(CLI::PositiveNumber + 0x20));
  local_1e0[0] = &local_1d0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_1e0,CLI::PositiveNumber._64_8_,
             CLI::PositiveNumber._72_8_ + CLI::PositiveNumber._64_8_);
  _local_1bc = CLI::PositiveNumber._100_2_;
  local_1c0 = CLI::PositiveNumber._96_4_;
  local_c30._M_unused._M_object = &local_c20;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c30,"");
  _local_1bc = CONCAT11(1,local_1bc);
  CLI::std::vector<CLI::Validator,_std::allocator<CLI::Validator>_>::emplace_back<CLI::Validator>
            (&pOVar2->validators_,(Validator *)&local_220);
  if (local_c30._8_8_ != 0) {
    local_ab8._M_unused._M_object = &local_aa8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_ab8,local_c30._M_unused._M_object,
               local_c30._8_8_ + (long)local_c30._M_unused._0_8_);
    commandLineParser();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c30._M_unused._0_8_ != &local_c20) {
    operator_delete(local_c30._M_unused._M_object,(ulong)(local_c20._M_allocated_capacity + 1));
  }
  if (local_1e0[0] != &local_1d0) {
    operator_delete(local_1e0[0],local_1d0._M_allocated_capacity + 1);
  }
  if (local_1f0 != (code *)0x0) {
    (*local_1f0)(&local_200,&local_200,__destroy_functor);
  }
  if (local_210 != (code *)0x0) {
    (*local_210)(&local_220,&local_220,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5d8._M_dataplus._M_p != &local_5d8.field_2) {
    operator_delete(local_5d8._M_dataplus._M_p,local_5d8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5b8._M_dataplus._M_p != &local_5b8.field_2) {
    operator_delete(local_5b8._M_dataplus._M_p,local_5b8.field_2._M_allocated_capacity + 1);
  }
  pAVar3 = (App *)(this->brokerName)._M_dataplus._M_p;
  local_5f8._M_dataplus._M_p = (pointer)&local_5f8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_5f8,"--networkretries","");
  local_618._M_dataplus._M_p = (pointer)&local_618.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_618,"the maximum number of network retries","");
  pOVar2 = CLI::App::add_option<int,_int,_(CLI::detail::enabler)0>
                     (pAVar3,&local_5f8,(int *)(variable[5].field_2._M_local_buf + 8),&local_618);
  CLI::Option::capture_default_str(pOVar2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_618._M_dataplus._M_p != &local_618.field_2) {
    operator_delete(local_618._M_dataplus._M_p,local_618.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5f8._M_dataplus._M_p != &local_5f8.field_2) {
    operator_delete(local_5f8._M_dataplus._M_p,local_5f8.field_2._M_allocated_capacity + 1);
  }
  pAVar3 = (App *)(this->brokerName)._M_dataplus._M_p;
  local_638._M_dataplus._M_p = (pointer)&local_638.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_638,"--useosport","");
  local_658._M_dataplus._M_p = (pointer)&local_658.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_658,
             "specify that the ports should be allocated by the host operating system","");
  CLI::App::add_flag<bool,_(CLI::detail::enabler)0>
            (pAVar3,&local_638,(bool *)(variable[5].field_2._M_local_buf + 0xe),&local_658);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_658._M_dataplus._M_p != &local_658.field_2) {
    operator_delete(local_658._M_dataplus._M_p,local_658.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_638._M_dataplus._M_p != &local_638.field_2) {
    operator_delete(local_638._M_dataplus._M_p,local_638.field_2._M_allocated_capacity + 1);
  }
  pAVar3 = (App *)(this->brokerName)._M_dataplus._M_p;
  local_678._M_dataplus._M_p = (pointer)&local_678.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_678,"--autobroker","");
  local_698._M_dataplus._M_p = (pointer)&local_698.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_698,
             "allow a broker to be automatically created if one is not available","");
  CLI::App::add_flag<bool,_(CLI::detail::enabler)0>
            (pAVar3,&local_678,(bool *)(variable[5].field_2._M_local_buf + 0xf),&local_698);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_698._M_dataplus._M_p != &local_698.field_2) {
    operator_delete(local_698._M_dataplus._M_p,local_698.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_678._M_dataplus._M_p != &local_678.field_2) {
    operator_delete(local_678._M_dataplus._M_p,local_678.field_2._M_allocated_capacity + 1);
  }
  pAVar3 = (App *)(this->brokerName)._M_dataplus._M_p;
  local_6b8._M_dataplus._M_p = (pointer)&local_6b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_6b8,"--brokerinitstring","");
  local_6d8._M_dataplus._M_p = (pointer)&local_6d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_6d8,"the initialization string for the broker","");
  CLI::App::
  add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
            (pAVar3,&local_6b8,variable + 3,&local_6d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6d8._M_dataplus._M_p != &local_6d8.field_2) {
    operator_delete(local_6d8._M_dataplus._M_p,local_6d8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6b8._M_dataplus._M_p != &local_6b8.field_2) {
    operator_delete(local_6b8._M_dataplus._M_p,local_6b8.field_2._M_allocated_capacity + 1);
  }
  pAVar3 = (App *)(this->brokerName)._M_dataplus._M_p;
  local_6f8._M_dataplus._M_p = (pointer)&local_6f8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_6f8,"--brokerinit","");
  local_718._M_dataplus._M_p = (pointer)&local_718.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_718,"the initialization string for the broker","");
  pOVar2 = CLI::App::
           add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
                     (pAVar3,&local_6f8,variable + 3,&local_718);
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"HELICS_BROKER_INIT","");
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&pOVar2->envname_,
             &local_90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_718._M_dataplus._M_p != &local_718.field_2) {
    operator_delete(local_718._M_dataplus._M_p,local_718.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6f8._M_dataplus._M_p != &local_6f8.field_2) {
    operator_delete(local_6f8._M_dataplus._M_p,local_6f8.field_2._M_allocated_capacity + 1);
  }
  pAVar3 = (App *)(this->brokerName)._M_dataplus._M_p;
  local_738._M_dataplus._M_p = (pointer)&local_738.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_738,"--client{0},--server{1}","")
  ;
  local_bb8._8_8_ = 0;
  pcStack_ba0 = CLI::std::
                _Function_handler<void_(long),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/network/NetworkBrokerData.cpp:116:13)>
                ::_M_invoke;
  local_ba8 = CLI::std::
              _Function_handler<void_(long),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/network/NetworkBrokerData.cpp:116:13)>
              ::_M_manager;
  local_bb8._M_unused._0_8_ = (undefined8)variable;
  local_758._M_dataplus._M_p = (pointer)&local_758.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_758,"specify that the network connection should be a server or client"
             ,"");
  pOVar2 = CLI::App::add_flag_function
                     (pAVar3,&local_738,(function<void_(long)> *)&local_bb8,&local_758);
  (pOVar2->super_OptionBase<CLI::Option>).disable_flag_override_ = true;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_758._M_dataplus._M_p != &local_758.field_2) {
    operator_delete(local_758._M_dataplus._M_p,local_758.field_2._M_allocated_capacity + 1);
  }
  if (local_ba8 != (code *)0x0) {
    (*local_ba8)((_Any_data *)&local_bb8,(_Any_data *)&local_bb8,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_738._M_dataplus._M_p != &local_738.field_2) {
    operator_delete(local_738._M_dataplus._M_p,local_738.field_2._M_allocated_capacity + 1);
  }
  pAVar3 = (App *)(this->brokerName)._M_dataplus._M_p;
  local_778._M_dataplus._M_p = (pointer)&local_778.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_778,"--local_interface","");
  local_ab8._8_8_ = 0;
  pcStack_aa0 = CLI::std::
                _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/network/NetworkBrokerData.cpp:132:9)>
                ::_M_invoke;
  local_aa8 = CLI::std::
              _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/network/NetworkBrokerData.cpp:132:9)>
              ::_M_manager;
  local_ab8._M_unused._0_8_ = (undefined8)variable;
  local_798._M_dataplus._M_p = (pointer)&local_798.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_798,"the local interface to use for the receive ports","");
  CLI::App::add_option_function<std::__cxx11::string>
            (pAVar3,&local_778,
             (function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              *)&local_ab8,&local_798);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_798._M_dataplus._M_p != &local_798.field_2) {
    operator_delete(local_798._M_dataplus._M_p,local_798.field_2._M_allocated_capacity + 1);
  }
  if (local_aa8 != (code *)0x0) {
    (*local_aa8)(&local_ab8,&local_ab8,3);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_778._M_dataplus._M_p != &local_778.field_2) {
    operator_delete(local_778._M_dataplus._M_p,local_778.field_2._M_allocated_capacity + 1);
  }
  pAVar3 = (App *)(this->brokerName)._M_dataplus._M_p;
  local_7b8._M_dataplus._M_p = (pointer)&local_7b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_7b8,"--port,-p","");
  local_b58._M_dataplus._M_p = (pointer)&local_b58.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b58,"port number to use","");
  pOVar2 = CLI::App::add_option<int,_int,_(CLI::detail::enabler)0>
                     (pAVar3,&local_7b8,(int *)(variable + 5),&local_b58);
  CLI::std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[5],_const_char_(&)[3],_true>
            ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_c30,(char (*) [5])0x44337f,(char (*) [3])0x4622a1);
  values_00._M_len = 1;
  values_00._M_array = (iterator)&local_c30;
  CLI::Transformer::Transformer<std::__cxx11::string(&)(std::__cxx11::string)>
            ((Transformer *)&local_ab8,values_00,CLI::ignore_case);
  local_328._M_unused._M_object =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_328._8_8_ = 0;
  local_318 = (code *)0x0;
  local_310 = pcStack_aa0;
  if (local_aa8 != (code *)0x0) {
    local_328._M_unused._M_object = local_ab8._M_unused._M_object;
    local_328._8_8_ = local_ab8._8_8_;
    local_318 = local_aa8;
    local_aa8 = (code *)0x0;
    pcStack_aa0 = (code *)0x0;
  }
  local_308._M_unused._M_object = (void *)0x0;
  local_308._8_8_ = 0;
  local_2f8 = (code *)0x0;
  local_2f0 = uStack_a80;
  if (local_a88 != (code *)0x0) {
    local_308._M_unused._M_object = local_a98._M_unused._M_object;
    local_308._8_8_ = local_a98._8_8_;
    local_2f8 = local_a88;
    local_a88 = (code *)0x0;
    uStack_a80 = 0;
  }
  paVar6 = &local_a78.first.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a78.first._M_dataplus._M_p == paVar6) {
    local_2d8._8_4_ = local_a78.first.field_2._8_4_;
    local_2d8._12_4_ = local_a78.first.field_2._12_4_;
    local_2e8 = &local_2d8;
  }
  else {
    local_2e8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_a78.first._M_dataplus._M_p;
  }
  local_2d8._M_allocated_capacity._4_4_ = local_a78.first.field_2._M_allocated_capacity._4_4_;
  local_2d8._M_allocated_capacity._0_4_ = local_a78.first.field_2._M_allocated_capacity._0_4_;
  local_2e0 = local_a78.first._M_string_length;
  local_a78.first._M_string_length = 0;
  local_a78.first.field_2._M_allocated_capacity._0_4_ =
       local_a78.first.field_2._M_allocated_capacity._0_4_ & 0xffffff00;
  local_2c8 = local_a78.second._M_dataplus._M_p._0_4_;
  local_2c4 = local_a78.second._M_dataplus._M_p._4_2_;
  local_c58._M_unused._M_object = &local_c48;
  local_a78.first._M_dataplus._M_p = (pointer)paVar6;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c58,"");
  CLI::std::vector<CLI::Validator,_std::allocator<CLI::Validator>_>::_M_insert_rval
            (&pOVar2->validators_,
             (pOVar2->validators_).
             super__Vector_base<CLI::Validator,_std::allocator<CLI::Validator>_>._M_impl.
             super__Vector_impl_data._M_start,(value_type *)&local_328);
  if (local_c58._8_8_ != 0) {
    local_af8[0] = local_ae8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_af8,local_c58._M_unused._M_object,
               local_c58._8_8_ + (long)local_c58._M_unused._0_8_);
    commandLineParser();
  }
  if ((_Manager_type *)local_c58._M_unused._0_8_ != &local_c48) {
    operator_delete(local_c58._M_unused._M_object,(ulong)(local_c48 + 1));
  }
  if (local_2e8 != &local_2d8) {
    operator_delete(local_2e8,local_2d8._M_allocated_capacity + 1);
  }
  if (local_2f8 != (code *)0x0) {
    (*local_2f8)(&local_308,&local_308,__destroy_functor);
  }
  if (local_318 != (code *)0x0) {
    (*local_318)((_Any_data *)&local_328,(_Any_data *)&local_328,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a78.first._M_dataplus._M_p != paVar6) {
    operator_delete(local_a78.first._M_dataplus._M_p,
                    CONCAT44(local_a78.first.field_2._M_allocated_capacity._4_4_,
                             local_a78.first.field_2._M_allocated_capacity._0_4_) + 1);
  }
  if (local_a88 != (code *)0x0) {
    (*local_a88)(&local_a98,&local_a98,3);
  }
  if (local_aa8 != (code *)0x0) {
    (*local_aa8)(&local_ab8,&local_ab8,3);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c10._M_unused._0_8_ != &local_c00) {
    operator_delete(local_c10._M_unused._M_object,(ulong)(local_c00._M_allocated_capacity + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c30._M_unused._0_8_ != &local_c20) {
    operator_delete(local_c30._M_unused._M_object,(ulong)(local_c20._M_allocated_capacity + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b58._M_dataplus._M_p != &local_b58.field_2) {
    operator_delete(local_b58._M_dataplus._M_p,local_b58.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7b8._M_dataplus._M_p != &local_7b8.field_2) {
    operator_delete(local_7b8._M_dataplus._M_p,local_7b8.field_2._M_allocated_capacity + 1);
  }
  pAVar3 = (App *)(this->brokerName)._M_dataplus._M_p;
  local_7d8._M_dataplus._M_p = (pointer)&local_7d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_7d8,"--brokerport","");
  local_7f8._M_dataplus._M_p = (pointer)&local_7f8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_7f8,"the port number to use to connect with the broker","");
  pOVar2 = CLI::App::add_option<int,_int,_(CLI::detail::enabler)0>
                     (pAVar3,&local_7d8,(int *)((long)&variable[5]._M_dataplus._M_p + 4),&local_7f8)
  ;
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"HELICS_BROKER_PORT","");
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&pOVar2->envname_,
             &local_b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7f8._M_dataplus._M_p != &local_7f8.field_2) {
    operator_delete(local_7f8._M_dataplus._M_p,local_7f8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7d8._M_dataplus._M_p != &local_7d8.field_2) {
    operator_delete(local_7d8._M_dataplus._M_p,local_7d8.field_2._M_allocated_capacity + 1);
  }
  pAVar3 = (App *)(this->brokerName)._M_dataplus._M_p;
  local_818._M_dataplus._M_p = (pointer)&local_818.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_818,"--connectionport","");
  local_838._M_dataplus._M_p = (pointer)&local_838.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_838,"the port number to use to connect a co-simulation","");
  pOVar2 = CLI::App::add_option<int,_int,_(CLI::detail::enabler)0>
                     (pAVar3,&local_818,(int *)&variable[5]._M_string_length,&local_838);
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"HELICS_CONNECTION_PORT","");
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&pOVar2->envname_,
             &local_d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_838._M_dataplus._M_p != &local_838.field_2) {
    operator_delete(local_838._M_dataplus._M_p,local_838.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_818._M_dataplus._M_p != &local_818.field_2) {
    operator_delete(local_818._M_dataplus._M_p,local_818.field_2._M_allocated_capacity + 1);
  }
  pAVar3 = (App *)(this->brokerName)._M_dataplus._M_p;
  local_858._M_dataplus._M_p = (pointer)&local_858.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_858,"--connectionaddress","");
  local_878._M_dataplus._M_p = (pointer)&local_878.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_878,"the network address to use to connect a co-simulation","");
  pOVar2 = CLI::App::
           add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
                     (pAVar3,&local_858,variable + 4,&local_878);
  local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_f0,"HELICS_CONNECTION_ADDRESS","");
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&pOVar2->envname_,
             &local_f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_878._M_dataplus._M_p != &local_878.field_2) {
    operator_delete(local_878._M_dataplus._M_p,local_878.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_858._M_dataplus._M_p != &local_858.field_2) {
    operator_delete(local_858._M_dataplus._M_p,local_858.field_2._M_allocated_capacity + 1);
  }
  pAVar3 = (App *)(this->brokerName)._M_dataplus._M_p;
  local_b78._M_dataplus._M_p = (pointer)&local_b78.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b78,"--localport","");
  local_c58._8_8_ = 0;
  pcStack_c40 = CLI::std::
                _Function_handler<void_(const_int_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/network/NetworkBrokerData.cpp:160:13)>
                ::_M_invoke;
  local_c48 = CLI::std::
              _Function_handler<void_(const_int_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/network/NetworkBrokerData.cpp:160:13)>
              ::_M_manager;
  local_b98._M_dataplus._M_p = (pointer)&local_b98.field_2;
  local_c58._M_unused._0_8_ = (undefined8)variable;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_b98,"port number for the local receive port","");
  pOVar2 = CLI::App::add_option_function<int>
                     (pAVar3,&local_b78,(function<void_(const_int_&)> *)&local_c58,&local_b98);
  CLI::std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[5],_const_char_(&)[3],_true>
            ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_ab8,(char (*) [5])0x44337f,(char (*) [3])0x4622a1);
  CLI::std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[3],_const_char_(&)[5],_true>
            (&local_a78,(char (*) [3])0x46283e,(char (*) [5])"-999");
  values_01._M_len = 2;
  values_01._M_array = (iterator)&local_ab8;
  CLI::Transformer::Transformer<std::__cxx11::string(&)(std::__cxx11::string)>
            ((Transformer *)&local_c30,values_01,CLI::ignore_case);
  local_398._M_unused._M_object =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)0x0;
  local_398._8_8_ = 0;
  local_388 = (code *)0x0;
  local_380 = local_c20._8_8_;
  if ((code *)local_c20._M_allocated_capacity != (code *)0x0) {
    local_398._M_unused._M_object = local_c30._M_unused._M_object;
    local_398._8_8_ = local_c30._8_8_;
    local_388 = (code *)local_c20._M_allocated_capacity;
    local_c20._M_allocated_capacity = 0;
    local_c20._8_8_ = 0;
  }
  local_378._M_unused._M_object =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)0x0;
  local_378._8_8_ = 0;
  local_368 = (code *)0x0;
  local_360 = local_c00._8_8_;
  if ((code *)local_c00._M_allocated_capacity != (code *)0x0) {
    local_378._M_unused._M_object = local_c10._M_unused._M_object;
    local_378._8_8_ = local_c10._8_8_;
    local_368 = (code *)local_c00._M_allocated_capacity;
    local_c00._M_allocated_capacity = 0;
    local_c00._8_8_ = 0;
  }
  if (local_bf0 == &local_be0) {
    local_348._8_4_ = local_be0._8_4_;
    local_348._12_4_ = local_be0._12_4_;
    local_358 = &local_348;
  }
  else {
    local_358 = local_bf0;
  }
  local_348._M_allocated_capacity._4_4_ = local_be0._M_allocated_capacity._4_4_;
  local_348._M_allocated_capacity._0_4_ = local_be0._M_allocated_capacity._0_4_;
  local_350 = local_be8;
  local_be8 = 0;
  local_be0._M_allocated_capacity._0_4_ = local_be0._M_allocated_capacity._0_4_ & 0xffffff00;
  local_338 = local_bd0;
  local_334 = local_bcc;
  local_bf0 = &local_be0;
  local_ad8 = local_ac8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_ad8,"");
  CLI::std::vector<CLI::Validator,_std::allocator<CLI::Validator>_>::_M_insert_rval
            (&pOVar2->validators_,
             (pOVar2->validators_).
             super__Vector_base<CLI::Validator,_std::allocator<CLI::Validator>_>._M_impl.
             super__Vector_impl_data._M_start,(value_type *)&local_398);
  if (local_ad0 != 0) {
    local_af8[0] = local_ae8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_af8,local_ad8,local_ad0 + (long)local_ad8);
    commandLineParser();
  }
  local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"HELICS_LOCAL_PORT","");
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&pOVar2->envname_,
             &local_110);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != &local_110.field_2) {
    operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
  }
  if (local_ad8 != local_ac8) {
    operator_delete(local_ad8,local_ac8[0] + 1);
  }
  if (local_358 != &local_348) {
    operator_delete(local_358,local_348._M_allocated_capacity + 1);
  }
  if (local_368 != (code *)0x0) {
    (*local_368)(&local_378,&local_378,__destroy_functor);
  }
  if (local_388 != (code *)0x0) {
    (*local_388)((_Any_data *)&local_398,(_Any_data *)&local_398,__destroy_functor);
  }
  if (local_bf0 != &local_be0) {
    operator_delete(local_bf0,
                    CONCAT44(local_be0._M_allocated_capacity._4_4_,
                             local_be0._M_allocated_capacity._0_4_) + 1);
  }
  if ((code *)local_c00._M_allocated_capacity != (code *)0x0) {
    (*(code *)local_c00._M_allocated_capacity)(&local_c10,&local_c10,3);
  }
  if ((code *)local_c20._M_allocated_capacity != (code *)0x0) {
    (*(code *)local_c20._M_allocated_capacity)(&local_c30,&local_c30,3);
  }
  lVar5 = -0x80;
  paVar6 = &local_a78.second.field_2;
  do {
    if (paVar6 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(&paVar6->_M_allocated_capacity)[-2]) {
      operator_delete((long *)(&paVar6->_M_allocated_capacity)[-2],paVar6->_M_allocated_capacity + 1
                     );
    }
    if (&paVar6->_M_allocated_capacity + -4 != (size_type *)(&paVar6->_M_allocated_capacity)[-6]) {
      operator_delete((size_type *)(&paVar6->_M_allocated_capacity)[-6],
                      (&paVar6->_M_allocated_capacity)[-4] + 1);
    }
    paVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(&paVar6->_M_allocated_capacity + -8);
    lVar5 = lVar5 + 0x40;
  } while (lVar5 != 0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b98._M_dataplus._M_p != &local_b98.field_2) {
    operator_delete(local_b98._M_dataplus._M_p,local_b98.field_2._M_allocated_capacity + 1);
  }
  if (local_c48 != (_Manager_type)0x0) {
    (*local_c48)((_Any_data *)&local_c58,(_Any_data *)&local_c58,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b78._M_dataplus._M_p != &local_b78.field_2) {
    operator_delete(local_b78._M_dataplus._M_p,local_b78.field_2._M_allocated_capacity + 1);
  }
  pAVar3 = (App *)(this->brokerName)._M_dataplus._M_p;
  local_898._M_dataplus._M_p = (pointer)&local_898.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_898,"--portstart","");
  local_8b8._M_dataplus._M_p = (pointer)&local_8b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_8b8,"starting port for automatic port definitions","");
  CLI::App::add_option<int,_int,_(CLI::detail::enabler)0>
            (pAVar3,&local_898,(int *)((long)&variable[5]._M_string_length + 4),&local_8b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8b8._M_dataplus._M_p != &local_8b8.field_2) {
    operator_delete(local_8b8._M_dataplus._M_p,local_8b8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_898._M_dataplus._M_p != &local_898.field_2) {
    operator_delete(local_898._M_dataplus._M_p,local_898.field_2._M_allocated_capacity + 1);
  }
  pAVar3 = (App *)(this->brokerName)._M_dataplus._M_p;
  local_8d8._M_dataplus._M_p = (pointer)&local_8d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_8d8,"encryption","");
  local_8f8._M_dataplus._M_p = (pointer)&local_8f8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_8f8,"options related to encryption","");
  pAVar3 = &CLI::App::add_option_group<CLI::Option_group>(pAVar3,&local_8d8,&local_8f8)->super_App;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8f8._M_dataplus._M_p != &local_8f8.field_2) {
    operator_delete(local_8f8._M_dataplus._M_p,local_8f8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8d8._M_dataplus._M_p != &local_8d8.field_2) {
    operator_delete(local_8d8._M_dataplus._M_p,local_8d8.field_2._M_allocated_capacity + 1);
  }
  local_918._M_dataplus._M_p = (pointer)&local_918.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_918,"--encrypted","");
  local_938._M_dataplus._M_p = (pointer)&local_938.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_938,"enable encryption on the network","");
  pOVar2 = CLI::App::add_flag<bool,_(CLI::detail::enabler)0>
                     (pAVar3,&local_918,(bool *)((long)&variable[6]._M_dataplus._M_p + 5),&local_938
                     );
  local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"HELICS_ENCRYPTION","");
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&pOVar2->envname_,
             &local_130);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_dataplus._M_p != &local_130.field_2) {
    operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_938._M_dataplus._M_p != &local_938.field_2) {
    operator_delete(local_938._M_dataplus._M_p,local_938.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_918._M_dataplus._M_p != &local_918.field_2) {
    operator_delete(local_918._M_dataplus._M_p,local_918.field_2._M_allocated_capacity + 1);
  }
  local_958._M_dataplus._M_p = (pointer)&local_958.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_958,"--encryption_config","");
  local_978._M_dataplus._M_p = (pointer)&local_978.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_978,"set the configuration file for encryption options","");
  pOVar2 = CLI::App::
           add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
                     (pAVar3,&local_958,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      &variable[6]._M_string_length,&local_978);
  local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_150,"HELICS_ENCRYPTION_CONFIG","");
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&pOVar2->envname_,
             &local_150);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._M_dataplus._M_p != &local_150.field_2) {
    operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_978._M_dataplus._M_p != &local_978.field_2) {
    operator_delete(local_978._M_dataplus._M_p,local_978.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_958._M_dataplus._M_p != &local_958.field_2) {
    operator_delete(local_958._M_dataplus._M_p,local_958.field_2._M_allocated_capacity + 1);
  }
  local_248._8_8_ = 0;
  pcStack_230 = CLI::std::
                _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/network/NetworkBrokerData.cpp:181:28)>
                ::_M_invoke;
  local_238 = CLI::std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/network/NetworkBrokerData.cpp:181:28)>
              ::_M_manager;
  local_248._M_unused._0_8_ = variable;
  helicsCLI11App::add_callback
            ((helicsCLI11App *)(this->brokerName)._M_dataplus._M_p,(function<void_()> *)&local_248);
  _Var4._M_pi = extraout_RDX;
  if (local_238 != (code *)0x0) {
    (*local_238)((_Any_data *)&local_248,(_Any_data *)&local_248,__destroy_functor);
    _Var4._M_pi = extraout_RDX_00;
  }
  sVar7.super___shared_ptr<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var4._M_pi;
  sVar7.super___shared_ptr<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<helics::helicsCLI11App>)
         sVar7.super___shared_ptr<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<helicsCLI11App> NetworkBrokerData::commandLineParser(std::string_view localAddress,
                                                                     bool enableConfig)
{
    auto nbparser = std::make_shared<helicsCLI11App>(
        "Network connection information \n(arguments allow '_' characters in the names and ignore them)");
    if (enableConfig) {
        auto* fmtr = addJsonConfig(nbparser.get());
        fmtr->maxLayers(0);
        fmtr->promoteSection("helics");
    }
    nbparser->option_defaults()->ignore_underscore()->ignore_case();

    auto* interfaceFlag = nbparser
                              ->add_flag("--local{0},--ipv4{4},--ipv6{6},--all{10},--external{10}",
                                         interfaceNetwork,
                                         "specify external interface to use, default is --local")
                              ->disable_flag_override();
    nbparser
        ->add_option("--network_connectivity",
                     interfaceNetwork,
                     "specify the connectivity of the network interface")
        ->transform(CLI::CheckedTransformer(
            {{"local", "0"}, {"ipv4", "4"}, {"ipv6", "6"}, {"external", "10"}, {"all", "10"}}))
        ->excludes(interfaceFlag);
    nbparser
        ->add_option_function<std::string>(
            "--broker_address",
            [this, localAddress](const std::string& addr) {
                auto brkprt = gmlc::networking::extractInterfaceAndPort(addr);
                brokerAddress = brkprt.first;
                brokerPort = brkprt.second;
                checkAndUpdateBrokerAddress(localAddress);
            },
            "location of the broker i.e. network address")
        ->envname("HELICS_BROKER_ADDRESS");
    nbparser->add_flag("--reuse_address",
                       reuse_address,
                       "allow the server to reuse a bound address, mostly useful for tcp cores");
    nbparser
        ->add_flag(
            "--noackconnect",
            noAckConnection,
            "specify that a connection_ack message is not required to be connected with a broker")
        ->ignore_underscore();

    nbparser->add_flag(
        "--force",
        forceConnection,
        "if set to true the broker will on an unsuccessful connection as root broker attempt to terminate any existing brokers and reconnect");
    nbparser->add_option_function<std::string>(
        "--broker",
        [this, localAddress](std::string addr) {
            auto brkr = BrokerFactory::findBroker(addr);
            if (brkr) {
                addr = brkr->getAddress();
            }
            if (brokerAddress.empty()) {
                auto brkprt = gmlc::networking::extractInterfaceAndPort(addr);
                brokerAddress = brkprt.first;
                brokerPort = brkprt.second;
                checkAndUpdateBrokerAddress(localAddress);
            } else {
                brokerName = addr;
            }
        },
        "identifier for the broker, this is either the name or network address use --broker_address or --brokername "
        "to explicitly set the network address or name the search for the broker is first by name");

    nbparser->add_option("--brokername", brokerName, "the name of the broker");
    nbparser->add_option("--maxsize", maxMessageSize, "The message buffer size")
        ->capture_default_str()
        ->check(CLI::PositiveNumber);
    nbparser
        ->add_option("--maxcount",
                     maxMessageCount,
                     "The maximum number of message to have in a queue")
        ->capture_default_str()
        ->check(CLI::PositiveNumber);
    nbparser->add_option("--networkretries", maxRetries, "the maximum number of network retries")
        ->capture_default_str();
    nbparser->add_flag("--useosport",
                       use_os_port,
                       "specify that the ports should be allocated by the host operating system");
    nbparser->add_flag("--autobroker",
                       autobroker,
                       "allow a broker to be automatically created if one is not available");
    nbparser->add_option("--brokerinitstring",
                         brokerInitString,
                         "the initialization string for the broker");
    nbparser
        ->add_option("--brokerinit", brokerInitString, "the initialization string for the broker")
        ->envname("HELICS_BROKER_INIT");
    nbparser
        ->add_flag_function(
            "--client{0},--server{1}",
            [this](int64_t val) {
                switch (server_mode) {
                    case ServerModeOptions::UNSPECIFIED:
                    case ServerModeOptions::SERVER_DEFAULT_ACTIVE:
                    case ServerModeOptions::SERVER_DEFAULT_DEACTIVATED:
                        server_mode = (val > 0) ? ServerModeOptions::SERVER_ACTIVE :
                                                  ServerModeOptions::SERVER_DEACTIVATED;
                        break;
                    default:
                        break;
                }
            },
            "specify that the network connection should be a server or client")
        ->disable_flag_override();
    nbparser->add_option_function<std::string>(
        "--local_interface",
        [this](const std::string& addr) {
            auto localprt = gmlc::networking::extractInterfaceAndPort(addr);
            localInterface = localprt.first;
            // this may get overridden later
            portNumber = localprt.second;
        },
        "the local interface to use for the receive ports");
    nbparser->add_option("--port,-p", portNumber, "port number to use")
        ->transform(CLI::Transformer({{"auto", "-1"}}, CLI::ignore_case));
    nbparser
        ->add_option("--brokerport",
                     brokerPort,
                     "the port number to use to connect with the broker")
        ->envname("HELICS_BROKER_PORT");

    nbparser
        ->add_option("--connectionport",
                     connectionPort,
                     "the port number to use to connect a co-simulation")
        ->envname("HELICS_CONNECTION_PORT");
    nbparser
        ->add_option("--connectionaddress",
                     connectionAddress,
                     "the network address to use to connect a co-simulation")
        ->envname("HELICS_CONNECTION_ADDRESS");
    nbparser
        ->add_option_function<int>(
            "--localport",
            [this](int port) {
                if (port == -999) {
                    use_os_port = true;
                } else {
                    portNumber = port;
                }
            },
            "port number for the local receive port")
        ->transform(CLI::Transformer({{"auto", "-1"}, {"os", "-999"}}, CLI::ignore_case))
        ->envname("HELICS_LOCAL_PORT");
    nbparser->add_option("--portstart", portStart, "starting port for automatic port definitions");

    auto* encrypt_group = nbparser->add_option_group("encryption", "options related to encryption");
    encrypt_group->add_flag("--encrypted", encrypted, "enable encryption on the network")
        ->envname("HELICS_ENCRYPTION");
    encrypt_group
        ->add_option("--encryption_config",
                     encryptionConfig,
                     "set the configuration file for encryption options")
        ->envname("HELICS_ENCRYPTION_CONFIG");

    nbparser->add_callback([this]() {
        if ((!brokerAddress.empty()) && (brokerPort == -1)) {
            if ((localInterface.empty()) && (portNumber != -1)) {
                std::swap(brokerPort, portNumber);
            }
        }
    });

    return nbparser;
}